

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::do_remove(tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            *this,key_type k,bool bypass_verifier)

{
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_00;
  size_t sVar1;
  internal iVar2;
  bool bVar3;
  undefined7 in_register_00000011;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  char *pcVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  pVar6;
  uint64_t key_prefix_splits_before;
  undefined1 local_100 [8];
  node_type_counter_array node_counts_before;
  inode_type_counter_array shrinking_inodes_before;
  size_t mem_use_before;
  undefined1 local_a8 [8];
  inode_type_counter_array growing_inodes_before;
  AssertHelper local_80;
  size_t mem_use_after;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  size_type remove_result;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  value_type leaf_count_after;
  
  if ((int)CONCAT71(in_register_00000011,bypass_verifier) == 0) {
    local_100 = (undefined1  [8])k;
    pVar6 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ::equal_range(&(this->values)._M_t,(key_type *)local_100);
    sVar1 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::_M_erase_aux(&(this->values)._M_t,(_Base_ptr)pVar6.first._M_node,
                   (_Base_ptr)pVar6.second._M_node);
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (sVar1 - (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_a8._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_100,"(remove_result)","(1)",(unsigned_long *)&local_68,
               (int *)local_a8);
    iVar2 = local_100[0];
    if (local_100[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a8);
      if (node_counts_before._M_elems[0] == 0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)node_counts_before._M_elems[0];
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(node_counts_before._M_elems + 4),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x121,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(node_counts_before._M_elems + 4),(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)(node_counts_before._M_elems + 4));
      if ((long *)CONCAT44(local_a8._4_4_,local_a8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a8._4_4_,local_a8._0_4_) + 8))();
      }
    }
    if (node_counts_before._M_elems[0] != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&node_counts_before,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   node_counts_before._M_elems[0]);
    }
    if (iVar2 == (internal)0x0) {
      return;
    }
  }
  this_00 = &this->test_db;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_node_counts
            ((node_type_counter_array *)local_100,this_00);
  shrinking_inodes_before._M_elems[3] =
       mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
       get_current_memory_use(this_00);
  local_a8._0_4_ = 0;
  testing::internal::CmpHelperGT<unsigned_long,int>
            ((internal *)&local_68,"(node_counts_before[as_i<unodb::node_type::LEAF>])","(0)",
             (unsigned_long *)local_100,(int *)local_a8);
  if (local_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (remove_result == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)remove_result;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(node_counts_before._M_elems + 4),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x127,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(node_counts_before._M_elems + 4),(Message *)local_a8);
LAB_001357d8:
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(node_counts_before._M_elems + 4));
    _Var4._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(local_a8._4_4_,local_a8._0_4_);
  }
  else {
    if (remove_result != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&remove_result,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   remove_result);
    }
    local_a8._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&local_68,"(mem_use_before)","(0)",shrinking_inodes_before._M_elems + 3,
               (int *)local_a8);
    if (local_68._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_a8);
      if (remove_result == 0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(node_counts_before._M_elems + 4),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x128,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(node_counts_before._M_elems + 4),(Message *)local_a8);
      goto LAB_001357d8;
    }
    if (remove_result != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&remove_result,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   remove_result);
    }
    mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
    get_growing_inode_counts((inode_type_counter_array *)local_a8,this_00);
    mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
    get_shrinking_inode_counts
              ((inode_type_counter_array *)(node_counts_before._M_elems + 4),this_00);
    mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
    get_key_prefix_splits(this_00);
    bVar3 = mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
            remove_internal(this_00,(art_key_type)
                                    (k >> 0x38 | (k & 0xff000000000000) >> 0x28 |
                                     (k & 0xff0000000000) >> 0x18 | (k & 0xff00000000) >> 8 |
                                     (k & 0xff000000) << 8 | (k & 0xff0000) << 0x18 |
                                     (k & 0xff00) << 0x28 | k << 0x38));
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"test_db.remove failed for ",0x1a);
      unodb::detail::dump_key<unsigned_long>((ostream *)&std::cerr,k);
      growing_inodes_before._M_elems[3] = CONCAT71(growing_inodes_before._M_elems[3]._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)(growing_inodes_before._M_elems + 3),1);
      mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
                (this_00,(ostream *)&std::cerr);
      testing::Message::Message((Message *)&local_68);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x135,"Failed");
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_68._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
      return;
    }
    if (this->parallel_test != false) {
      return;
    }
    local_80.data_ =
         (AssertHelperData *)
         mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
         get_current_memory_use(this_00);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_68,"(mem_use_after)","(mem_use_before)",(unsigned_long *)&local_80
               ,shrinking_inodes_before._M_elems + 3);
    if (local_68._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (remove_result == 0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(growing_inodes_before._M_elems + 3),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x14c,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(growing_inodes_before._M_elems + 3),(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)(growing_inodes_before._M_elems + 3));
      _Var4._M_head_impl = local_40._M_head_impl;
    }
    else {
      if (remove_result != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&remove_result,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     remove_result);
      }
      local_40._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
           get_node_count<(unodb::node_type)0>(this_00);
      growing_inodes_before._M_elems[3] = (long)local_100 - 1;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_68,"(leaf_count_after)",
                 "(node_counts_before[as_i<unodb::node_type::LEAF>] - 1)",(unsigned_long *)&local_40
                 ,growing_inodes_before._M_elems + 3);
      if (local_68._M_head_impl._0_1_ != (internal)0x0) goto LAB_001357f6;
      testing::Message::Message((Message *)(growing_inodes_before._M_elems + 3));
      if (remove_result == 0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mem_use_before,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x151,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&mem_use_before,(Message *)(growing_inodes_before._M_elems + 3));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem_use_before);
      _Var4._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           growing_inodes_before._M_elems[3];
    }
  }
  if (_Var4._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var4._M_head_impl + 8))();
  }
LAB_001357f6:
  if (remove_result != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&remove_result,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)remove_result)
    ;
  }
  return;
}

Assistant:

void do_remove(key_type k, bool bypass_verifier) {
    if (!bypass_verifier) {
      const auto remove_result = values.erase(to_ikey(k));
      UNODB_ASSERT_EQ(remove_result, 1);
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto node_counts_before = test_db.get_node_counts();
    const auto mem_use_before = test_db.get_current_memory_use();
    UNODB_ASSERT_GT(node_counts_before[as_i<unodb::node_type::LEAF>], 0);
    UNODB_ASSERT_GT(mem_use_before, 0);
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      if (!test_db.remove(k)) {
        // LCOV_EXCL_START
        std::cerr << "test_db.remove failed for ";
        unodb::detail::dump_key(std::cerr, k);
        std::cerr << '\n';
        test_db.dump(std::cerr);
        FAIL();
        // LCOV_EXCL_STOP
      }
    } catch (...) {
#ifdef UNODB_DETAIL_WITH_STATS
      if (!parallel_test) {
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
      }
#endif  // UNODB_DETAIL_WITH_STATS
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    if (!parallel_test) {
      const auto mem_use_after = test_db.get_current_memory_use();
      UNODB_ASSERT_LT(mem_use_after, mem_use_before);

      const auto leaf_count_after =
          test_db.template get_node_count<::unodb::node_type::LEAF>();
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] - 1);
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }